

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

string * __thiscall
jsonnet::internal::bop_string_abi_cxx11_(string *__return_storage_ptr__,internal *this,BinaryOp bop)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "*";
    pcVar2 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "/";
    pcVar2 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "%";
    pcVar2 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "+";
    pcVar2 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "-";
    pcVar2 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "<<";
    pcVar2 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = ">>";
    pcVar2 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = ">";
    pcVar2 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = ">=";
    pcVar2 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "<";
    pcVar2 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "<=";
    pcVar2 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "in";
    pcVar2 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "==";
    pcVar2 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "!=";
    pcVar2 = "";
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "&";
    pcVar2 = "";
    break;
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "^";
    pcVar2 = "";
    break;
  case 0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "|";
    pcVar2 = "";
    break;
  case 0x11:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "&&";
    pcVar2 = "";
    break;
  case 0x12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "||";
    pcVar2 = "";
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unrecognised binary operator: ")
    ;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)this);
    std::endl<char,std::char_traits<char>>(poVar1);
    abort();
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string bop_string(BinaryOp bop)
{
    switch (bop) {
        case BOP_MULT: return "*";
        case BOP_DIV: return "/";
        case BOP_PERCENT: return "%";

        case BOP_PLUS: return "+";
        case BOP_MINUS: return "-";

        case BOP_SHIFT_L: return "<<";
        case BOP_SHIFT_R: return ">>";

        case BOP_GREATER: return ">";
        case BOP_GREATER_EQ: return ">=";
        case BOP_LESS: return "<";
        case BOP_LESS_EQ: return "<=";
        case BOP_IN: return "in";

        case BOP_MANIFEST_EQUAL: return "==";
        case BOP_MANIFEST_UNEQUAL: return "!=";

        case BOP_BITWISE_AND: return "&";
        case BOP_BITWISE_XOR: return "^";
        case BOP_BITWISE_OR: return "|";

        case BOP_AND: return "&&";
        case BOP_OR: return "||";

        default:
            std::cerr << "INTERNAL ERROR: Unrecognised binary operator: " << bop << std::endl;
            std::abort();
    }
}